

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theme.c
# Opt level: O0

natwm_error color_value_from_string(char *string,color_value **result)

{
  natwm_error nVar1;
  color_value *__ptr;
  color_value *value;
  color_value **result_local;
  char *string_local;
  
  __ptr = (color_value *)malloc(0x10);
  if (__ptr == (color_value *)0x0) {
    string_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    __ptr->string = string;
    __ptr->color_value = 0;
    nVar1 = string_to_rgb(string,&__ptr->color_value);
    if (nVar1 == NO_ERROR) {
      *result = __ptr;
      string_local._4_4_ = NO_ERROR;
    }
    else {
      free(__ptr);
      string_local._4_4_ = INVALID_INPUT_ERROR;
    }
  }
  return string_local._4_4_;
}

Assistant:

enum natwm_error color_value_from_string(const char *string, struct color_value **result)
{
        struct color_value *value = malloc(sizeof(struct color_value));

        if (value == NULL) {
                return MEMORY_ALLOCATION_ERROR;
        }

        value->string = string;
        value->color_value = 0;

        if (string_to_rgb(string, &value->color_value) != NO_ERROR) {
                free(value);

                return INVALID_INPUT_ERROR;
        }

        *result = value;

        return NO_ERROR;
}